

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

Abc_Cex_t * Abc_CexTransformUndc(Abc_Cex_t *p,char *pInit)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  Abc_Cex_t *pAVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  
  sVar5 = strlen(pInit);
  uVar9 = 0;
  iVar11 = 0;
  uVar7 = (uint)sVar5;
  if (0 < (int)uVar7) {
    uVar8 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + (uint)(pInit[uVar8] == 'x');
      uVar8 = uVar8 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar8);
  }
  iVar2 = p->iFrame;
  iVar3 = p->nPis;
  iVar15 = iVar3 - iVar11;
  uVar14 = (iVar2 + 1) * iVar15 + uVar7;
  pAVar6 = (Abc_Cex_t *)
           calloc(1,(long)(int)((((int)uVar14 >> 5) + 1) - (uint)((uVar14 & 0x1f) == 0)) * 4 + 0x14)
  ;
  pAVar6->nRegs = uVar7;
  pAVar6->nPis = iVar15;
  pAVar6->nBits = uVar14;
  pAVar6->iPo = p->iPo;
  pAVar6->iFrame = iVar2;
  iVar10 = 0;
  if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      cVar1 = pInit[uVar9];
      if ((cVar1 == '1') ||
         ((cVar1 == 'x' &&
          (uVar12 = iVar15 + iVar10 + p->nRegs,
          ((uint)(&p[1].iPo)[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) != 0)))) {
        (&pAVar6[1].iPo)[uVar9 >> 5 & 0x7ffffff] =
             (&pAVar6[1].iPo)[uVar9 >> 5 & 0x7ffffff] | 1 << ((byte)uVar9 & 0x1f);
      }
      iVar10 = iVar10 + (uint)(cVar1 == 'x');
      uVar9 = uVar9 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar9);
    uVar9 = sVar5 & 0xffffffff;
  }
  uVar7 = (uint)uVar9;
  if (iVar10 != iVar11) {
    __assert_fail("iAddPi == nAddPis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                  ,0x1d2,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
  }
  if (-1 < iVar2) {
    iVar10 = 0;
    iVar11 = 0;
    do {
      if (0 < iVar15) {
        iVar4 = p->nRegs;
        iVar13 = 0;
        do {
          uVar7 = iVar4 + iVar10 + iVar13;
          if (((uint)(&p[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) {
            iVar15 = iVar13 + (int)uVar9;
            (&pAVar6[1].iPo)[iVar15 >> 5] =
                 (&pAVar6[1].iPo)[iVar15 >> 5] | 1 << ((byte)iVar15 & 0x1f);
            iVar15 = pAVar6->nPis;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar15);
        uVar9 = (ulong)(uint)((int)uVar9 + iVar13);
      }
      uVar7 = (uint)uVar9;
      iVar10 = iVar10 + iVar3;
      bVar16 = iVar11 != iVar2;
      iVar11 = iVar11 + 1;
    } while (bVar16);
    uVar14 = pAVar6->nBits;
  }
  if (uVar7 == uVar14) {
    return pAVar6;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                ,0x1d8,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
}

Assistant:

Abc_Cex_t * Abc_CexTransformUndc( Abc_Cex_t * p, char * pInit )
{
    Abc_Cex_t * pCex;
    int nFlops = strlen(pInit);
    int i, f, iBit, iAddPi = 0, nAddPis = 0;
    // count how many flops got a new PI
    for ( i = 0; i < nFlops; i++ )
        nAddPis += (int)(pInit[i] == 'x');
    // create new CEX
    pCex = Abc_CexAlloc( nFlops, p->nPis - nAddPis, p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( iBit = 0; iBit < nFlops; iBit++ )
    {
        if ( pInit[iBit] == '1' || (pInit[iBit] == 'x' && Abc_InfoHasBit(p->pData, p->nRegs + p->nPis - nAddPis + iAddPi)) )
            Abc_InfoSetBit( pCex->pData, iBit );
        iAddPi += (int)(pInit[iBit] == 'x');
    }
    assert( iAddPi == nAddPis );
    // add timeframes
    for ( f = 0; f <= p->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + p->nPis * f + i) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}